

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_get_product_root_type(coda_product *product,coda_type **type)

{
  coda_type *local_28;
  coda_type **type_local;
  coda_product *product_local;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x410);
    product_local._4_4_ = -1;
  }
  else if (type == (coda_type **)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x415);
    product_local._4_4_ = -1;
  }
  else {
    if ((product->product_definition == (coda_product_definition *)0x0) ||
       (product->product_definition->root_type == (coda_type *)0x0)) {
      if (product->root_type->backend < coda_backend_memory) {
        local_28 = (coda_type *)product->root_type;
      }
      else {
        local_28 = product->root_type->definition;
      }
      *type = local_28;
    }
    else {
      *type = product->product_definition->root_type;
    }
    product_local._4_4_ = 0;
  }
  return product_local._4_4_;
}

Assistant:

LIBCODA_API int coda_get_product_root_type(const coda_product *product, coda_type **type)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL && product->product_definition->root_type != NULL)
    {
        *type = product->product_definition->root_type;
    }
    else
    {
        *type = coda_get_type_for_dynamic_type(product->root_type);
    }

    return 0;
}